

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  void *pvVar1;
  uint uVar2;
  undefined8 uVar3;
  uint i;
  long lVar4;
  
  if (num != 0) {
    pvVar1 = (void *)((long)pSrc_void + (ulong)num * 0x48);
    do {
      lVar4 = 0;
      do {
        *(undefined4 *)((long)pDst_void + lVar4 * 4) = *(undefined4 *)((long)pSrc_void + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 6);
      *(undefined4 *)((long)pDst_void + 0x20) = *(undefined4 *)((long)pSrc_void + 0x20);
      *(undefined8 *)((long)pDst_void + 0x18) = *(undefined8 *)((long)pSrc_void + 0x18);
      *(undefined8 *)((long)pDst_void + 0x28) = 0;
      *(undefined8 *)((long)pDst_void + 0x30) = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)((long)pDst_void + 0x28),*(uint *)((long)pSrc_void + 0x30),
                 false,4,(object_mover)0x0,false);
      uVar2 = *(uint *)((long)pSrc_void + 0x30);
      *(uint *)((long)pDst_void + 0x30) = uVar2;
      memcpy(*(void **)((long)pDst_void + 0x28),*(void **)((long)pSrc_void + 0x28),(ulong)uVar2 << 2
            );
      uVar3 = *(undefined8 *)((long)pSrc_void + 0x38);
      *(undefined8 *)((long)pDst_void + 0x3d) = *(undefined8 *)((long)pSrc_void + 0x3d);
      *(undefined8 *)((long)pDst_void + 0x38) = uVar3;
      if (*(void **)((long)pSrc_void + 0x28) != (void *)0x0) {
        crnlib_free(*(void **)((long)pSrc_void + 0x28));
      }
      pSrc_void = (void *)((long)pSrc_void + 0x48);
      pDst_void = (void *)((long)pDst_void + 0x48);
    } while (pSrc_void != pvVar1);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }